

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O3

REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents)

{
  REF_MPI pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  REF_AGENT_STRUCT *pRVar3;
  bool bVar4;
  int iVar5;
  REF_STATUS RVar6;
  REF_INT *pRVar7;
  void *pvVar8;
  undefined8 uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  long lVar14;
  REF_INT nsend;
  long lVar15;
  long lVar16;
  REF_INT nrecv;
  int local_74;
  REF_INT dest;
  REF_INT local_6c;
  REF_MPI local_68;
  void *local_60;
  void *local_58;
  REF_INT *local_50;
  REF_DBL *recv_dbl;
  REF_GLOB *recv_glob;
  REF_INT *recv_int;
  
  pRVar1 = ref_agents->ref_mpi;
  iVar5 = ref_agents->max;
  if (iVar5 < 1) {
    local_6c = 0;
    uVar10 = 0;
    bVar4 = false;
  }
  else {
    lVar15 = 0;
    lVar14 = 0;
    uVar10 = 0;
    do {
      if (*(int *)((long)ref_agents->agent->xyz + lVar15 + -0x30) != 0) {
        RVar6 = ref_agents_dest((REF_AGENTS)ref_agents->agent,(REF_INT)lVar14,&dest);
        if (RVar6 != 0) {
          pcVar13 = "dest";
          uVar10 = 1;
          uVar9 = 0x115;
          uVar12 = 1;
          goto LAB_001034b0;
        }
        uVar10 = uVar10 + (pRVar1->id != dest);
        iVar5 = ref_agents->max;
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x68;
    } while (lVar14 < iVar5);
    bVar4 = 0 < iVar5;
    if ((int)uVar10 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
             0x11d,"ref_agents_migrate","malloc destination of REF_INT negative");
      return 1;
    }
  }
  uVar12 = (ulong)uVar10;
  pRVar7 = (REF_INT *)malloc(uVar12 * 4);
  if (pRVar7 == (REF_INT *)0x0) {
    pcVar13 = "malloc destination of REF_INT NULL";
    uVar9 = 0x11d;
    goto LAB_00103768;
  }
  local_68 = pRVar1;
  if (uVar12 != 0) {
    memset(pRVar7,0xff,uVar12 * 4);
  }
  pvVar8 = malloc((ulong)(uVar10 * 6) * 4);
  if (pvVar8 == (void *)0x0) {
    pcVar13 = "malloc send_int of REF_INT NULL";
    uVar9 = 0x11e;
    goto LAB_00103768;
  }
  local_58 = pvVar8;
  if (uVar12 == 0) {
    pvVar8 = malloc(0);
    if (pvVar8 == (void *)0x0) goto LAB_00103724;
  }
  else {
    memset(pvVar8,0xff,(ulong)(uVar10 * 6) << 2);
    pvVar8 = malloc(uVar12 * 8);
    if (pvVar8 == (void *)0x0) {
LAB_00103724:
      pcVar13 = "malloc send_glob of REF_GLOB NULL";
      uVar9 = 0x11f;
      goto LAB_00103768;
    }
    memset(pvVar8,0xff,uVar12 * 8);
  }
  local_60 = pvVar8;
  local_50 = pRVar7;
  pvVar8 = malloc((ulong)(uVar10 * 7) * 8);
  if (pvVar8 == (void *)0x0) {
    pcVar13 = "malloc send_dbl of REF_DBL NULL";
    uVar9 = 0x120;
LAB_00103768:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",uVar9,
           "ref_agents_migrate",pcVar13);
    return 2;
  }
  if (uVar12 != 0) {
    memset(pvVar8,0,(ulong)(uVar10 * 7) << 3);
  }
  lVar14 = 0;
  nsend = 0;
  if (bVar4) {
    lVar14 = 0;
    lVar15 = 0x30;
    lVar16 = 0x48;
    local_74 = 0;
    do {
      if (ref_agents->agent[lVar14].mode != REF_AGENT_UNUSED) {
        uVar10 = ref_agents_dest((REF_AGENTS)ref_agents->agent,(REF_INT)lVar14,&dest);
        if (uVar10 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
                 0x123,"ref_agents_migrate",(ulong)uVar10,"dest");
          return 1;
        }
        if (local_68->id != dest) {
          local_50[local_74] = dest;
          pRVar2 = ref_agents->agent;
          lVar11 = (long)(local_74 * 6);
          *(REF_AGENT_MODE *)((long)local_58 + lVar11 * 4) = pRVar2[lVar14].mode;
          *(REF_INT *)((long)local_58 + (long)(local_74 * 6 + 1) * 4) = pRVar2[lVar14].home;
          *(REF_INT *)((long)local_58 + lVar11 * 4 + 8) = pRVar2[lVar14].node;
          *(REF_INT *)((long)local_58 + lVar11 * 4 + 0xc) = pRVar2[lVar14].part;
          *(REF_INT *)((long)local_58 + lVar11 * 4 + 0x10) = pRVar2[lVar14].seed;
          *(REF_INT *)((long)local_58 + lVar11 * 4 + 0x14) = pRVar2[lVar14].step;
          *(REF_GLOB *)((long)local_60 + (long)local_74 * 8) = pRVar2[lVar14].global;
          lVar11 = 0;
          do {
            *(undefined8 *)((long)pvVar8 + lVar11 * 8 + (long)(local_74 * 7) * 8) =
                 *(undefined8 *)((long)pRVar2->xyz + lVar11 * 8 + lVar15 + -0x30);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 3);
          lVar11 = 0;
          do {
            *(undefined8 *)((long)pvVar8 + (long)(local_74 * 7 + 3 + (int)lVar11) * 8) =
                 *(undefined8 *)((long)pRVar2->xyz + lVar11 * 8 + lVar16 + -0x30);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 4);
          uVar10 = ref_agents_remove(ref_agents,(REF_INT)lVar14);
          if (uVar10 != 0) {
            pcVar13 = "poof";
            uVar9 = 0x134;
            goto LAB_00103880;
          }
          local_74 = local_74 + 1;
        }
      }
      lVar14 = lVar14 + 1;
      lVar15 = lVar15 + 0x68;
      lVar16 = lVar16 + 0x68;
      nsend = local_74;
    } while (lVar14 < ref_agents->max);
  }
  pRVar7 = local_50;
  pRVar1 = local_68;
  local_6c = (REF_INT)lVar14;
  uVar10 = ref_mpi_blindsend(local_68,local_50,local_58,6,nsend,&recv_int,&nrecv,1);
  if (uVar10 != 0) {
    pcVar13 = "is";
    uVar9 = 0x13c;
LAB_00103880:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",uVar9,
           "ref_agents_migrate",(ulong)uVar10,pcVar13);
    return uVar10;
  }
  uVar10 = ref_mpi_blindsend(pRVar1,pRVar7,local_60,1,nsend,&recv_glob,&nrecv,2);
  if (uVar10 != 0) {
    pcVar13 = "is";
    uVar9 = 0x13f;
    goto LAB_00103880;
  }
  uVar10 = ref_mpi_blindsend(pRVar1,pRVar7,pvVar8,7,nsend,&recv_dbl,&nrecv,3);
  if (uVar10 != 0) {
    pcVar13 = "ds";
    uVar9 = 0x142;
    goto LAB_00103880;
  }
  free(pvVar8);
  free(local_60);
  free(local_58);
  free(pRVar7);
  if (nrecv < 1) {
    if (recv_dbl == (REF_DBL *)0x0) goto LAB_001039b3;
  }
  else {
    lVar16 = 0x18;
    lVar14 = 0;
    lVar15 = 0;
    do {
      uVar10 = ref_agents_new(ref_agents,&local_6c);
      if (uVar10 != 0) {
        pcVar13 = "new";
        uVar9 = 0x149;
        uVar12 = (ulong)uVar10;
LAB_001034b0:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_agents.c",
               uVar9,"ref_agents_migrate",uVar12,pcVar13);
        return uVar10;
      }
      pRVar3 = ref_agents->agent;
      pRVar2 = pRVar3 + local_6c;
      pRVar2->mode = recv_int[lVar15 * 6];
      pRVar2->home = recv_int[lVar15 * 6 + 1];
      pRVar2->node = recv_int[lVar15 * 6 + 2];
      pRVar2->part = recv_int[lVar15 * 6 + 3];
      pRVar2->seed = recv_int[lVar15 * 6 + 4];
      pRVar2->step = recv_int[lVar15 * 6 + 5];
      pRVar2->global = recv_glob[lVar15];
      lVar11 = 0;
      do {
        pRVar2->xyz[lVar11] = *(REF_DBL *)((long)recv_dbl + lVar11 * 8 + lVar14);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar11 = 0;
      do {
        pRVar3[local_6c].bary[lVar11] = *(REF_DBL *)((long)recv_dbl + lVar11 * 8 + lVar16);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 4);
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0x38;
      lVar16 = lVar16 + 0x38;
    } while (lVar15 < nrecv);
  }
  free(recv_dbl);
LAB_001039b3:
  if (recv_glob != (REF_GLOB *)0x0) {
    free(recv_glob);
  }
  if (recv_int != (REF_INT *)0x0) {
    free(recv_int);
    return 0;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_migrate(REF_AGENTS ref_agents) {
  REF_MPI ref_mpi = ref_agents->ref_mpi;
  REF_INT i, id, nsend, nrecv, dest, rec;
  REF_INT n_ints, n_globs, n_dbls;
  REF_INT *destination, *send_int, *recv_int;
  REF_GLOB *send_glob, *recv_glob;
  REF_DBL *send_dbl, *recv_dbl;
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      nsend++;
    }
  }
  n_ints = 6;
  n_globs = 1;
  n_dbls = 7;
  ref_malloc_init(destination, nsend, REF_INT, REF_EMPTY);
  ref_malloc_init(send_int, nsend * n_ints, REF_INT, REF_EMPTY);
  ref_malloc_init(send_glob, nsend * n_globs, REF_GLOB, REF_EMPTY);
  ref_malloc_init(send_dbl, nsend * n_dbls, REF_DBL, 0.0);
  nsend = 0;
  each_active_ref_agent(ref_agents, id) {
    RSS(ref_agents_dest(ref_agents, id, &dest), "dest");
    if (ref_mpi_rank(ref_mpi) != dest) {
      destination[nsend] = dest;
      send_int[0 + nsend * n_ints] = (REF_INT)ref_agent_mode(ref_agents, id);
      send_int[1 + nsend * n_ints] = ref_agent_home(ref_agents, id);
      send_int[2 + nsend * n_ints] = ref_agent_node(ref_agents, id);
      send_int[3 + nsend * n_ints] = ref_agent_part(ref_agents, id);
      send_int[4 + nsend * n_ints] = ref_agent_seed(ref_agents, id);
      send_int[5 + nsend * n_ints] = ref_agent_step(ref_agents, id);

      send_glob[0 + nsend * n_globs] = ref_agent_global(ref_agents, id);

      for (i = 0; i < 3; i++)
        send_dbl[i + nsend * n_dbls] = ref_agent_xyz(ref_agents, i, id);
      for (i = 0; i < 4; i++)
        send_dbl[3 + i + nsend * n_dbls] = ref_agent_bary(ref_agents, i, id);

      RSS(ref_agents_remove(ref_agents, id), "poof");

      nsend++;
    }
  }

  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_int, n_ints, nsend,
                        (void **)(&recv_int), &nrecv, REF_INT_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_glob, n_globs, nsend,
                        (void **)(&recv_glob), &nrecv, REF_GLOB_TYPE),
      "is");
  RSS(ref_mpi_blindsend(ref_mpi, destination, (void *)send_dbl, n_dbls, nsend,
                        (void **)(&recv_dbl), &nrecv, REF_DBL_TYPE),
      "ds");
  ref_free(send_dbl);
  ref_free(send_glob);
  ref_free(send_int);
  ref_free(destination);

  for (rec = 0; rec < nrecv; rec++) {
    RSS(ref_agents_new(ref_agents, &id), "new");
    ref_agent_mode(ref_agents, id) = (REF_AGENT_MODE)recv_int[0 + rec * n_ints];
    ref_agent_home(ref_agents, id) = recv_int[1 + rec * n_ints];
    ref_agent_node(ref_agents, id) = recv_int[2 + rec * n_ints];
    ref_agent_part(ref_agents, id) = recv_int[3 + rec * n_ints];
    ref_agent_seed(ref_agents, id) = recv_int[4 + rec * n_ints];
    ref_agent_step(ref_agents, id) = recv_int[5 + rec * n_ints];

    ref_agent_global(ref_agents, id) = recv_glob[0 + rec * n_globs];

    for (i = 0; i < 3; i++)
      ref_agent_xyz(ref_agents, i, id) = recv_dbl[i + rec * n_dbls];
    for (i = 0; i < 4; i++)
      ref_agent_bary(ref_agents, i, id) = recv_dbl[3 + i + rec * n_dbls];
  }

  ref_free(recv_dbl);
  ref_free(recv_glob);
  ref_free(recv_int);

  return REF_SUCCESS;
}